

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFDie::getAddressRanges
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFDie *this)

{
  DWARFUnit *this_00;
  bool bVar1;
  DWARFFormValue *pDVar2;
  unsigned_long *puVar3;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 *this_01;
  initializer_list<llvm::DWARFAddressRange> __l;
  Optional<unsigned_long> OVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aStack_98;
  Optional<llvm::DWARFFormValue> Value;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_58;
  uint64_t local_50;
  uint64_t local_48;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_40;
  uint64_t LowPC;
  uint64_t HighPC;
  uint64_t Index;
  
  bVar1 = isNULL(this);
  if (bVar1) {
    this_01 = &aStack_98;
  }
  else {
    bVar1 = getLowAndHighPC(this,&local_40.value,&LowPC,&HighPC);
    if (bVar1) {
      local_58 = local_40;
      local_50 = LowPC;
      local_48 = HighPC;
      this_01 = &aStack_98;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_58;
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 this_01,__l,(allocator_type *)((long)&Index + 7));
      goto LAB_00d95747;
    }
    find((Optional<llvm::DWARFFormValue> *)&aStack_98,this,DW_AT_ranges);
    if (Value.Storage.field_0._40_1_ == '\x01') {
      pDVar2 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)&aStack_98);
      this_00 = this->U;
      if (pDVar2->Form == DW_FORM_rnglistx) {
        pDVar2 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                           ((OptionalStorage<llvm::DWARFFormValue,_true> *)&aStack_98);
        OVar4 = DWARFFormValue::getAsSectionOffset(pDVar2);
        local_58 = OVar4.Storage.field_0;
        local_50 = CONCAT71(local_50._1_7_,OVar4.Storage.hasVal);
        puVar3 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                           ((OptionalStorage<unsigned_long,_true> *)&local_58);
        DWARFUnit::findRnglistFromIndex(__return_storage_ptr__,this_00,(uint32_t)*puVar3);
        return __return_storage_ptr__;
      }
      pDVar2 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)&aStack_98);
      OVar4 = DWARFFormValue::getAsSectionOffset(pDVar2);
      local_58 = OVar4.Storage.field_0;
      local_50 = CONCAT71(local_50._1_7_,OVar4.Storage.hasVal);
      puVar3 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_58);
      DWARFUnit::findRnglistFromOffset(__return_storage_ptr__,this_00,*puVar3);
      return __return_storage_ptr__;
    }
    this_01 = &local_58;
  }
  this_01->value = 0;
  this_01[1].value = 0;
  this_01[2].value = 0;
LAB_00d95747:
  Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
  Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
            ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
              *)__return_storage_ptr__,
             (vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)this_01,
             (type *)0x0);
  std::_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
  ~_Vector_base((_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                this_01);
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector> DWARFDie::getAddressRanges() const {
  if (isNULL())
    return DWARFAddressRangesVector();
  // Single range specified by low/high PC.
  uint64_t LowPC, HighPC, Index;
  if (getLowAndHighPC(LowPC, HighPC, Index))
    return DWARFAddressRangesVector{{LowPC, HighPC, Index}};

  Optional<DWARFFormValue> Value = find(DW_AT_ranges);
  if (Value) {
    if (Value->getForm() == DW_FORM_rnglistx)
      return U->findRnglistFromIndex(*Value->getAsSectionOffset());
    return U->findRnglistFromOffset(*Value->getAsSectionOffset());
  }
  return DWARFAddressRangesVector();
}